

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  undefined8 *puVar1;
  short sVar2;
  Scope *pSVar3;
  undefined8 uVar4;
  anon_union_8_2_eba6ea51_for_Binding_4 aVar5;
  Reader type_00;
  Reader brand;
  uint16_t uVar6;
  Which whichType;
  RawBrandedSchema *pRVar7;
  long lVar8;
  uint64_t typeId;
  undefined2 uVar9;
  ushort uVar10;
  Which expectedKind;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_00;
  Reader enumType;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_150;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_138;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_120;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_108;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  if (type._reader.dataSize < 0x10) {
    uVar9 = 0;
switchD_002fecc3_caseD_0:
    result->which = (uint8_t)uVar9;
  }
  else {
    uVar9 = *type._reader.data;
    enumType._reader._32_8_ = type._reader._32_8_;
    switch(uVar9) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      goto switchD_002fecc3_caseD_0;
    case 0xe:
      enumType._reader.nestingLimit = type._reader.nestingLimit;
      enumType._reader._44_4_ = type._reader._44_4_;
      enumType._reader.data = type._reader.data;
      enumType._reader.pointers = type._reader.pointers;
      enumType._reader.segment = type._reader.segment;
      enumType._reader.capTable = type._reader.capTable;
      capnp::schema::Type::List::Reader::getElementType(&local_f0,(Reader *)&enumType);
      local_150.ptr.isSet = (brandBindings->ptr).isSet;
      if (local_150.ptr.isSet == true) {
        local_150.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
        local_150.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
      }
      type_00._reader.capTable = local_f0._reader.capTable;
      type_00._reader.segment = local_f0._reader.segment;
      type_00._reader.data = local_f0._reader.data;
      type_00._reader.pointers = local_f0._reader.pointers;
      type_00._reader.dataSize = local_f0._reader.dataSize;
      type_00._reader.pointerCount = local_f0._reader.pointerCount;
      type_00._reader._38_2_ = local_f0._reader._38_2_;
      type_00._reader.nestingLimit = local_f0._reader.nestingLimit;
      type_00._reader._44_4_ = local_f0._reader._44_4_;
      makeDep(this,result,type_00,scopeName,&local_150);
      result->listDepth = result->listDepth + 1;
      return;
    case 0xf:
      enumType._reader.nestingLimit = type._reader.nestingLimit;
      enumType._reader._44_4_ = type._reader._44_4_;
      enumType._reader.data = type._reader.data;
      enumType._reader.pointers = type._reader.pointers;
      enumType._reader.segment = type._reader.segment;
      enumType._reader.capTable = type._reader.capTable;
      if (type._reader.dataSize < 0x80) {
        typeId = 0;
      }
      else {
        typeId = *(uint64_t *)((long)type._reader.data + 8);
      }
      capnp::schema::Type::Enum::Reader::getBrand(&local_90,&enumType);
      local_120.ptr.isSet = (brandBindings->ptr).isSet;
      if (local_120.ptr.isSet == true) {
        local_120.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
        local_120.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
      }
      whichType = ENUM;
      expectedKind = ENUM;
      brandBindings_00 = &local_120;
      local_c0._reader.segment = local_90._reader.segment;
      local_c0._reader.capTable = local_90._reader.capTable;
      local_c0._reader.data = local_90._reader.data;
      local_c0._reader.pointers = local_90._reader.pointers;
      local_c0._reader._32_8_ = local_90._reader._32_8_;
      local_c0._reader._40_8_ = local_90._reader._40_8_;
      break;
    case 0x10:
      enumType._reader.nestingLimit = type._reader.nestingLimit;
      enumType._reader._44_4_ = type._reader._44_4_;
      enumType._reader.data = type._reader.data;
      enumType._reader.pointers = type._reader.pointers;
      enumType._reader.segment = type._reader.segment;
      enumType._reader.capTable = type._reader.capTable;
      if (type._reader.dataSize < 0x80) {
        typeId = 0;
      }
      else {
        typeId = *(uint64_t *)((long)type._reader.data + 8);
      }
      capnp::schema::Type::Struct::Reader::getBrand(&local_60,(Reader *)&enumType);
      local_108.ptr.isSet = (brandBindings->ptr).isSet;
      if (local_108.ptr.isSet == true) {
        local_108.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
        local_108.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
      }
      whichType = STRUCT;
      expectedKind = STRUCT;
      brandBindings_00 = &local_108;
      local_c0._reader.segment = local_60._reader.segment;
      local_c0._reader.capTable = local_60._reader.capTable;
      local_c0._reader.data = local_60._reader.data;
      local_c0._reader.pointers = local_60._reader.pointers;
      local_c0._reader._32_8_ = local_60._reader._32_8_;
      local_c0._reader._40_8_ = local_60._reader._40_8_;
      break;
    case 0x11:
      enumType._reader.nestingLimit = type._reader.nestingLimit;
      enumType._reader._44_4_ = type._reader._44_4_;
      enumType._reader.data = type._reader.data;
      enumType._reader.pointers = type._reader.pointers;
      enumType._reader.segment = type._reader.segment;
      enumType._reader.capTable = type._reader.capTable;
      if (type._reader.dataSize < 0x80) {
        typeId = 0;
      }
      else {
        typeId = *(uint64_t *)((long)type._reader.data + 8);
      }
      capnp::schema::Type::Interface::Reader::getBrand(&local_c0,(Reader *)&enumType);
      local_138.ptr.isSet = (brandBindings->ptr).isSet;
      if (local_138.ptr.isSet == true) {
        local_138.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
        local_138.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
      }
      whichType = INTERFACE;
      expectedKind = INTERFACE;
      brandBindings_00 = &local_138;
      break;
    case 0x12:
      result->which = '\x12';
      if (type._reader.dataSize < 0x50) {
        return;
      }
      sVar2 = *(short *)((long)type._reader.data + 8);
      if (sVar2 == 0) {
        return;
      }
      if (sVar2 == 2) {
        result->isImplicitParameter = true;
        if (type._reader.dataSize < 0x60) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(uint16_t *)((long)type._reader.data + 10);
        }
        result->paramIndex = uVar6;
        return;
      }
      if (sVar2 != 1) goto switchD_002fecc3_default;
      if (type._reader.dataSize < 0xc0) {
        pRVar7 = (RawBrandedSchema *)0x0;
        uVar10 = 0;
        if (type._reader.dataSize < 0x60) goto LAB_002ff007;
      }
      else {
        pRVar7 = *(RawBrandedSchema **)((long)type._reader.data + 0x10);
      }
      uVar10 = *(ushort *)((long)type._reader.data + 10);
LAB_002ff007:
      if ((brandBindings->ptr).isSet == true) {
        pSVar3 = (brandBindings->ptr).field_1.value.ptr;
        lVar8 = 0;
        while( true ) {
          if ((brandBindings->ptr).field_1.value.size_ * 0x18 - lVar8 == 0) {
            return;
          }
          if (*(RawBrandedSchema **)((long)&pSVar3->typeId + lVar8) == pRVar7) break;
          lVar8 = lVar8 + 0x18;
        }
        if ((&pSVar3->isUnbound)[lVar8] != true) {
          if (*(uint *)((long)&pSVar3->bindingCount + lVar8) <= (uint)uVar10) {
            return;
          }
          puVar1 = (undefined8 *)(*(long *)((long)&pSVar3->bindings + lVar8) + (ulong)uVar10 * 0x10)
          ;
          uVar4 = *puVar1;
          aVar5 = *(anon_union_8_2_eba6ea51_for_Binding_4 *)(puVar1 + 1);
          result->which = (char)uVar4;
          result->isImplicitParameter = (bool)(char)((ulong)uVar4 >> 8);
          result->listDepth = (short)((ulong)uVar4 >> 0x10);
          result->paramIndex = (short)((ulong)uVar4 >> 0x20);
          *(short *)&result->field_0x6 = (short)((ulong)uVar4 >> 0x30);
          result->field_4 = aVar5;
          return;
        }
      }
      (result->field_4).schema = pRVar7;
      result->paramIndex = uVar10;
      return;
    default:
switchD_002fecc3_default:
      kj::_::unreachable();
    }
    brand._reader.capTable = local_c0._reader.capTable;
    brand._reader.segment = local_c0._reader.segment;
    brand._reader.data = local_c0._reader.data;
    brand._reader.pointers = local_c0._reader.pointers;
    brand._reader.dataSize = local_c0._reader.dataSize;
    brand._reader.pointerCount = local_c0._reader.pointerCount;
    brand._reader._38_2_ = local_c0._reader._38_2_;
    brand._reader.nestingLimit = local_c0._reader.nestingLimit;
    brand._reader._44_4_ = local_c0._reader._44_4_;
    makeDep(this,result,typeId,whichType,expectedKind,brand,scopeName,brandBindings_00);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  switch (type.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      result.which = static_cast<uint8_t>(type.which());
      return;

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      makeDep(result, structType.getTypeId(), schema::Type::STRUCT, schema::Node::STRUCT,
              structType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      makeDep(result, enumType.getTypeId(), schema::Type::ENUM, schema::Node::ENUM,
              enumType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      makeDep(result, interfaceType.getTypeId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              interfaceType.getBrand(), scopeName, brandBindings);
      return;
    }

    case schema::Type::LIST: {
      makeDep(result, type.getList().getElementType(), scopeName, brandBindings);
      ++result.listDepth;
      return;
    }

    case schema::Type::ANY_POINTER: {
      result.which = static_cast<uint8_t>(schema::Type::ANY_POINTER);
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          uint64_t id = param.getScopeId();
          uint16_t index = param.getParameterIndex();

          KJ_IF_SOME(b, brandBindings) {
            // TODO(perf): We could binary search here, but... bleh.
            for (auto& scope: b) {
              if (scope.typeId == id) {
                if (scope.isUnbound) {
                  // Unbound brand parameter.
                  result.scopeId = id;
                  result.paramIndex = index;
                  return;
                } else if (index >= scope.bindingCount) {
                  // Binding index out-of-range. Treat as AnyPointer. This is important to allow
                  // new type parameters to be added to existing types without breaking dependent
                  // schemas.
                  return;
                } else {
                  result = scope.bindings[index];
                  return;
                }
              }
            }
            return;
          } else {
            // Unbound brand parameter.
            result.scopeId = id;
            result.paramIndex = index;
            return;
          }
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          result.isImplicitParameter = true;
          result.paramIndex = anyPointer.getImplicitMethodParameter().getParameterIndex();
          return;
      }
      KJ_UNREACHABLE;
    }
  }